

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O1

void __thiscall CECorrections::free_members(CECorrections *this)

{
  std::vector<int,_std::allocator<int>_>::clear(&this->nutation_mjd_);
  std::vector<double,_std::allocator<double>_>::clear(&this->nutation_dut1_);
  std::vector<double,_std::allocator<double>_>::clear(&this->nutation_xp_);
  std::vector<double,_std::allocator<double>_>::clear(&this->nutation_yp_);
  std::vector<double,_std::allocator<double>_>::clear(&this->nutation_deps_);
  std::vector<double,_std::allocator<double>_>::clear(&this->nutation_dpsi_);
  std::vector<double,_std::allocator<double>_>::clear(&this->ttut1_mjd_);
  std::vector<double,_std::allocator<double>_>::clear(&this->ttut1_delt_);
  return;
}

Assistant:

void CECorrections::free_members(void)
{
    // Clear the nutation vectors
    nutation_mjd_.clear();
    nutation_dut1_.clear();
    nutation_xp_.clear();
    nutation_yp_.clear();
    nutation_deps_.clear();
    nutation_dpsi_.clear();

    // Clear the TT-UT1 vectors
    ttut1_mjd_.clear();
    ttut1_delt_.clear();
}